

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::ScopeVisitor::visit(ScopeVisitor *this,ScopeBase *scope)

{
  bool bVar1;
  reference puVar2;
  pointer pSVar3;
  ScopeBase *local_a8;
  long local_98;
  ScopeBase *local_88;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *ss_1;
  const_iterator __end6;
  const_iterator __begin6;
  Scope<std::nullptr_t> *__range6;
  Scope<std::nullptr_t> *s;
  VarStmt *v;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *ss;
  const_iterator __end4;
  const_iterator __begin4;
  Module *__range4;
  Module *m;
  ScopeBase *scope_local;
  ScopeVisitor *this_local;
  
  if (scope == (ScopeBase *)0x0) {
    local_88 = (ScopeBase *)0x0;
  }
  else {
    local_88 = (ScopeBase *)__dynamic_cast(scope,&ScopeBase::typeinfo,&Module::typeinfo,0);
  }
  if (local_88 == (ScopeBase *)0x0) {
    if (scope == (ScopeBase *)0x0) {
      local_98 = 0;
    }
    else {
      local_98 = __dynamic_cast(scope,&ScopeBase::typeinfo,&VarStmt::typeinfo,0);
    }
    if (local_98 == 0) {
      if (scope == (ScopeBase *)0x0) {
        local_a8 = (ScopeBase *)0x0;
      }
      else {
        local_a8 = (ScopeBase *)
                   __dynamic_cast(scope,&ScopeBase::typeinfo,&Scope<decltype(nullptr)>::typeinfo,0);
      }
      if (local_a8 != (ScopeBase *)0x0) {
        __end6 = ScopeBase::begin(local_a8);
        ss_1 = (unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *)
               ScopeBase::end(local_a8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end6,(__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
                                           *)&ss_1), bVar1) {
          puVar2 = __gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
                   ::operator*(&__end6);
          pSVar3 = std::
                   unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>::
                   get(puVar2);
          visit(this,pSVar3);
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
          ::operator++(&__end6);
        }
        (*this->_vptr_ScopeVisitor[2])(this,local_a8);
      }
    }
    else {
      (*this->_vptr_ScopeVisitor[1])(this,local_98);
    }
  }
  else {
    __end4 = ScopeBase::begin(local_88);
    ss = (unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *)
         ScopeBase::end(local_88);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
                                       *)&ss), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
               ::operator*(&__end4);
      pSVar3 = std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>::
               get(puVar2);
      visit(this,pSVar3);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
      ::operator++(&__end4);
    }
    (**this->_vptr_ScopeVisitor)(this,local_88);
  }
  return;
}

Assistant:

void visit(ScopeBase *scope) {
            if (auto *m = dynamic_cast<Module *>(scope)) {
                for (auto const &ss : *m) {
                    visit(ss.get());
                }
                handle(m);
            } else if (auto *v = dynamic_cast<VarStmt *>(scope)) {
                handle(v);
            } else if (auto *s = dynamic_cast<Scope<> *>(scope)) {
                for (auto const &ss : *s) {
                    visit(ss.get());
                }
                handle(s);
            }
        }